

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestOneof2_NestedMessage::Clear(TestOneof2_NestedMessage *this)

{
  uint32_t cached_has_bits;
  TestOneof2_NestedMessage *this_local;
  
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.corge_int_);
  (this->field_0)._impl_.moo_int_ = 0;
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestOneof2_NestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestOneof2.NestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.corge_int_.Clear();
  _impl_.moo_int_ = ::int64_t{0};
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}